

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hash_test.cc
# Opt level: O0

void twohash_test(void)

{
  uint32_t uVar1;
  int iVar2;
  time_t tVar3;
  undefined1 auStack_188 [248];
  undefined8 uStack_90;
  uint64_t local_88;
  uint local_80;
  uint local_7c;
  time_t *local_78;
  undefined1 *local_70;
  int *array;
  uint32_t h;
  int j;
  int i;
  int n;
  timeval __test_interval_ins;
  timeval __test_interval_total;
  timeval __test_cur;
  timeval __test_prev;
  timeval __test_begin;
  
  local_78 = (time_t *)0x0;
  uStack_90 = 0x103e3c;
  gettimeofday((timeval *)&__test_prev.tv_usec,(__timezone_ptr_t)0x0);
  uStack_90 = 0x103e4d;
  tVar3 = time(local_78);
  uStack_90 = 0x103e54;
  srand((uint)tVar3);
  j = 0x40;
  local_70 = auStack_188;
  for (h = 100; (int)h < 0x6c; h = h + 1) {
    for (array._4_4_ = 0x14d; (int)array._4_4_ < 0x155; array._4_4_ = array._4_4_ + 1) {
      local_80 = h;
      local_7c = array._4_4_;
      uVar1 = hash_shuffle_2uint((long)(int)h,(long)(int)array._4_4_);
      printf("(%d,%d) = %u\n",(ulong)local_80,(ulong)local_7c,(ulong)uVar1);
    }
  }
  for (h = 0; (int)h < j; h = h + 1) {
    *(undefined4 *)(local_70 + (long)(int)h * 4) = 0;
  }
  for (h = 0; (int)h < 1000; h = h + 1) {
    for (array._4_4_ = 0; (int)array._4_4_ < 1000; array._4_4_ = array._4_4_ + 1) {
      iVar2 = rand();
      local_88 = (uint64_t)(iVar2 % 0x8000);
      iVar2 = rand();
      uVar1 = hash_shuffle_2uint(local_88,(long)(iVar2 % 0x8000));
      array._0_4_ = uVar1 & j - 1U;
      *(int *)(local_70 + (ulong)(uint)array * 4) = *(int *)(local_70 + (ulong)(uint)array * 4) + 1;
    }
  }
  for (h = 0; (int)h < j; h = h + 1) {
    printf("%d %d\n",(ulong)h,(ulong)*(uint *)(local_70 + (long)(int)h * 4));
  }
  if (twohash_test::__test_pass == 0) {
    fprintf(_stderr,"%s FAILED\n","two-integer hash test");
  }
  else {
    fprintf(_stderr,"%s PASSED\n","two-integer hash test");
  }
  return;
}

Assistant:

void twohash_test()
{
    TEST_INIT();

    randomize();

    int n = 64;
    int i,j;
    uint32_t h;
    int *array = alca(int, n);

    for (i=100;i<108;++i) {
        for (j=333;j<341;++j){
            printf("(%d,%d) = %u\n", i, j, hash_shuffle_2uint(i,j));
        }
    }
    for (i=0;i<n;++i) array[i] = 0;
    for (i=0;i<1000;++i) {
        for (j=0;j<1000;++j){
            h = hash_shuffle_2uint(random(32768), random(32768)) & (uint32_t)(n-1);
            array[h]++;
        }
    }
    for (i=0;i<n;++i) {
        DBG("%d %d\n",i,array[i]);
    }

    TEST_RESULT("two-integer hash test");
}